

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfdjs_json_mapping_api.cpp
# Opt level: O0

json * __thiscall
cfd::js::api::json::
ExecuteElementsCheckApi<cfd::js::api::json::GetWitnessStackNumRequest,cfd::js::api::json::GetWitnessStackNumResponse,cfd::js::api::GetWitnessStackNumRequestStruct,cfd::js::api::GetWitnessStackNumResponseStruct>
          (json *this,string *request_message,
          function<cfd::js::api::GetWitnessStackNumResponseStruct_(const_cfd::js::api::GetWitnessStackNumRequestStruct_&)>
          *bitcoin_function,
          function<cfd::js::api::GetWitnessStackNumResponseStruct_(const_cfd::js::api::GetWitnessStackNumRequestStruct_&)>
          *elements_function)

{
  ErrorResponse local_6d0;
  JsonClassBase<cfd::js::api::json::ErrorResponseBase> local_618 [4];
  JsonClassBase<cfd::js::api::json::GetWitnessStackNumResponse> local_5f8 [4];
  undefined1 local_5d8 [8];
  GetWitnessStackNumResponse res_2;
  GetWitnessStackNumResponseStruct local_590;
  GetWitnessStackNumResponseStruct local_4e0;
  undefined1 local_430 [8];
  GetWitnessStackNumResponseStruct response;
  GetWitnessStackNumRequestStruct request;
  ErrorResponse res_1;
  CfdException *cfd_except;
  ErrorResponse res;
  CfdException ex;
  undefined1 local_e8 [8];
  GetWitnessStackNumRequest req;
  function<cfd::js::api::GetWitnessStackNumResponseStruct_(const_cfd::js::api::GetWitnessStackNumRequestStruct_&)>
  *elements_function_local;
  function<cfd::js::api::GetWitnessStackNumResponseStruct_(const_cfd::js::api::GetWitnessStackNumRequestStruct_&)>
  *bitcoin_function_local;
  string *request_message_local;
  string *json_message;
  
  req.txin_._88_8_ = elements_function;
  GetWitnessStackNumRequest::GetWitnessStackNumRequest((GetWitnessStackNumRequest *)local_e8);
  core::JsonClassBase<cfd::js::api::json::GetWitnessStackNumRequest>::Deserialize
            ((JsonClassBase<cfd::js::api::json::GetWitnessStackNumRequest> *)local_e8,
             request_message);
  GetWitnessStackNumRequest::ConvertToStruct
            ((GetWitnessStackNumRequestStruct *)
             &response.ignore_items._M_t._M_impl.super__Rb_tree_header._M_node_count,
             (GetWitnessStackNumRequest *)local_e8);
  GetWitnessStackNumResponseStruct::GetWitnessStackNumResponseStruct
            ((GetWitnessStackNumResponseStruct *)local_430);
  if ((request._24_1_ & 1) == 0) {
    std::
    function<cfd::js::api::GetWitnessStackNumResponseStruct_(const_cfd::js::api::GetWitnessStackNumRequestStruct_&)>
    ::operator()(&local_590,bitcoin_function,
                 (GetWitnessStackNumRequestStruct *)
                 &response.ignore_items._M_t._M_impl.super__Rb_tree_header._M_node_count);
    GetWitnessStackNumResponseStruct::operator=
              ((GetWitnessStackNumResponseStruct *)local_430,&local_590);
    GetWitnessStackNumResponseStruct::~GetWitnessStackNumResponseStruct(&local_590);
  }
  else {
    std::
    function<cfd::js::api::GetWitnessStackNumResponseStruct_(const_cfd::js::api::GetWitnessStackNumRequestStruct_&)>
    ::operator()(&local_4e0,elements_function,
                 (GetWitnessStackNumRequestStruct *)
                 &response.ignore_items._M_t._M_impl.super__Rb_tree_header._M_node_count);
    GetWitnessStackNumResponseStruct::operator=
              ((GetWitnessStackNumResponseStruct *)local_430,&local_4e0);
    GetWitnessStackNumResponseStruct::~GetWitnessStackNumResponseStruct(&local_4e0);
  }
  res_2._63_1_ = 0;
  std::__cxx11::string::string((string *)this);
  if (response.count == 0) {
    GetWitnessStackNumResponse::GetWitnessStackNumResponse((GetWitnessStackNumResponse *)local_5d8);
    GetWitnessStackNumResponse::ConvertFromStruct
              ((GetWitnessStackNumResponse *)local_5d8,(GetWitnessStackNumResponseStruct *)local_430
              );
    core::JsonClassBase<cfd::js::api::json::GetWitnessStackNumResponse>::Serialize_abi_cxx11_
              (local_5f8);
    std::__cxx11::string::operator=((string *)this,(string *)local_5f8);
    std::__cxx11::string::~string((string *)local_5f8);
    GetWitnessStackNumResponse::~GetWitnessStackNumResponse((GetWitnessStackNumResponse *)local_5d8)
    ;
  }
  else {
    ErrorResponse::ConvertFromStruct(&local_6d0,(InnerErrorResponseStruct *)&response);
    core::JsonClassBase<cfd::js::api::json::ErrorResponseBase>::Serialize_abi_cxx11_(local_618);
    std::__cxx11::string::operator=((string *)this,(string *)local_618);
    std::__cxx11::string::~string((string *)local_618);
    ErrorResponse::~ErrorResponse(&local_6d0);
  }
  res_2._63_1_ = 1;
  GetWitnessStackNumResponseStruct::~GetWitnessStackNumResponseStruct
            ((GetWitnessStackNumResponseStruct *)local_430);
  GetWitnessStackNumRequestStruct::~GetWitnessStackNumRequestStruct
            ((GetWitnessStackNumRequestStruct *)
             &response.ignore_items._M_t._M_impl.super__Rb_tree_header._M_node_count);
  GetWitnessStackNumRequest::~GetWitnessStackNumRequest((GetWitnessStackNumRequest *)local_e8);
  return this;
}

Assistant:

std::string ExecuteElementsCheckApi(
    const std::string &request_message,
    std::function<ResponseStructType(const RequestStructType &)>
        bitcoin_function,  // NOLINT
    std::function<ResponseStructType(const RequestStructType &)>
        elements_function) {  // NOLINT
  // リクエストjson_strから、モデルへ変換
  RequestType req;
  try {
    req.Deserialize(request_message);
  } catch (const CfdException &cfd_except) {
    ErrorResponse res = ErrorResponse::ConvertFromCfdException(cfd_except);
    return res.Serialize();
  } catch (...) {
    CfdException ex(
        CfdError::kCfdOutOfRangeError,
        "JSON value convert error. Value out of range.");
    ErrorResponse res = ErrorResponse::ConvertFromCfdException(ex);
    return res.Serialize();
  }
  RequestStructType request = req.ConvertToStruct();
  ResponseStructType response;
  if (request.is_elements) {
#ifndef CFD_DISABLE_ELEMENTS
    response = elements_function(request);
#else
    CfdException ex(
        CfdError::kCfdIllegalArgumentError, "functionType not supported.");
    ErrorResponse res = ErrorResponse::ConvertFromCfdException(ex);
    return res.Serialize();
#endif  // CFD_DISABLE_ELEMENTS
  } else {
#ifndef CFD_DISABLE_BITCOIN
    response = bitcoin_function(request);
#else
    CfdException ex(
        CfdError::kCfdIllegalArgumentError, "functionType not supported.");
    ErrorResponse res = ErrorResponse::ConvertFromCfdException(ex);
    return res.Serialize();
#endif  // CFD_DISABLE_BITCOIN
  }
  std::string json_message;
  if (response.error.code == 0) {
    ResponseType res;
    res.ConvertFromStruct(response);
    json_message = res.Serialize();
  } else {
    json_message =
        ErrorResponse::ConvertFromStruct(response.error).Serialize();
  }

  // utf-8
  return json_message;
}